

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,regexp_literal_expression *e)

{
  regexp_flag f;
  wostream *pwVar1;
  regexp *prVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  wstring_view __str;
  regexp_literal_expression *e_local;
  print_visitor *this_local;
  
  pwVar1 = std::operator<<(this->os_,'/');
  prVar2 = regexp_literal_expression::re(e);
  __str = regexp::pattern(prVar2);
  pbVar3 = std::operator<<(pwVar1,__str);
  pwVar1 = std::operator<<(pbVar3,'/');
  prVar2 = regexp_literal_expression::re(e);
  f = regexp::flags(prVar2);
  mjs::operator<<(pwVar1,f);
  return;
}

Assistant:

void operator()(const regexp_literal_expression& e) {
        os_ << '/' << e.re().pattern() << '/' << e.re().flags();
    }